

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

void __thiscall
PruneReplayer::access_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info)

{
  size_type sVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  iterator iVar3;
  uint32_t stage;
  ulong uVar4;
  VkPipelineLayout __v;
  uint32_t i;
  long lVar5;
  VkRenderPass local_40;
  Hash hash_local;
  
  hash_local = hash;
  sVar1 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->accessed_graphics_pipelines)._M_h,&hash_local);
  if (sVar1 == 0) {
    std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->accessed_graphics_pipelines,&hash_local);
    __v = create_info->layout;
    access_pipeline_layout(this,(Hash)__v);
    if (create_info->renderPass != (VkRenderPass)0x0) {
      __v = (VkPipelineLayout)&local_40;
      local_40 = create_info->renderPass;
      std::__detail::
      _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->accessed_render_passes,(value_type *)__v);
    }
    lVar5 = 0x18;
    for (uVar4 = 0; uVar4 < create_info->stageCount; uVar4 = uVar4 + 1) {
      local_40 = *(VkRenderPass *)((long)&create_info->pStages->sType + lVar5);
      __v = (VkPipelineLayout)&local_40;
      std::__detail::
      _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->accessed_shader_modules,(value_type *)&local_40);
      lVar5 = lVar5 + 0x30;
    }
    pVVar2 = find_pnext<VkPipelineLibraryCreateInfoKHR>((VkStructureType)create_info->pNext,__v);
    if (pVVar2 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      for (uVar4 = 0; uVar4 < pVVar2->libraryCount; uVar4 = uVar4 + 1) {
        local_40 = (VkRenderPass)pVVar2->pLibraries[uVar4];
        iVar3 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->library_graphics_pipelines)._M_h,(key_type *)&local_40);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
            ._M_cur != (__node_type *)0x0) {
          access_graphics_pipeline
                    (this,*(Hash *)((long)iVar3.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                                          ._M_cur + 8),
                     *(VkGraphicsPipelineCreateInfo **)
                      ((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                             ._M_cur + 0x10));
        }
      }
    }
  }
  return;
}

Assistant:

void access_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info)
	{
		if (accessed_graphics_pipelines.count(hash))
			return;
		accessed_graphics_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		if (create_info->renderPass != VK_NULL_HANDLE)
			accessed_render_passes.insert((Hash) create_info->renderPass);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		auto *library_info =
				find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
				                                           create_info->pNext);

		if (library_info)
		{
			for (uint32_t i = 0; i < library_info->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_graphics_pipelines.find((Hash) library_info->pLibraries[i]);
				if (lib_itr != library_graphics_pipelines.end())
					access_graphics_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}